

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O2

void flatbuffers::tests::Offset64Evolution(void)

{
  return_type rVar1;
  return_type rVar2;
  Offset<v1::RootTable> root;
  Offset<v2::RootTable> OVar3;
  uint *puVar4;
  Vector<unsigned_char,_unsigned_int> *pVVar5;
  Vector<unsigned_char,_unsigned_int> *pVVar6;
  Vector64<uint8_t> *pVVar7;
  RootTable *pRVar8;
  RootTable *pRVar9;
  float fVar10;
  float fVar11;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> giant_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> big_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  FlatBufferBuilder builder;
  
  builder.buf_.allocator_ = (Allocator *)CONCAT44(builder.buf_.allocator_._4_4_,0x4030201);
  __l._M_len = 4;
  __l._M_array = (iterator)&builder;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,__l,(allocator_type *)&big_data);
  builder.buf_.allocator_ = (Allocator *)CONCAT35(builder.buf_.allocator_._5_3_,0xa09080706);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&builder;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&big_data,__l_00,(allocator_type *)&giant_data);
  builder.buf_.allocator_ = (Allocator *)0x0;
  builder.buf_.own_allocator_ = false;
  builder.buf_.initial_size_ = 0x400;
  builder.buf_.max_size_ = 0x7fffffff;
  builder.buf_.buffer_minalign_ = 8;
  builder.buf_.reserved_ = 0;
  builder.buf_._48_8_ = (ulong)(uint)builder.buf_._52_4_ << 0x20;
  builder.length_of_64_bit_region_ = 0;
  builder.nested = false;
  builder.finished = false;
  builder.buf_.buf_ = (uint8_t *)0x0;
  builder.buf_.cur_._0_6_ = 0;
  builder.buf_.cur_._6_2_ = 0;
  builder.buf_.scratch_._0_6_ = 0;
  builder._78_8_ = 0;
  builder.minalign_ = 1;
  builder.force_defaults_ = false;
  builder.dedup_vtables_ = true;
  builder.string_pool = (StringOffsetMap *)0x0;
  root = v1::CreateRootTableDirect(&builder,1234.0,&data);
  FlatBufferBuilderImpl<false>::Finish<v1::RootTable>(&builder,root,(char *)0x0);
  puVar4 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer(&builder);
  if (puVar4 == (uint *)0x0) {
    pRVar9 = (RootTable *)0x0;
  }
  else {
    pRVar9 = (RootTable *)((ulong)*puVar4 + (long)puVar4);
  }
  puVar4 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer(&builder);
  if (puVar4 == (uint *)0x0) {
    pRVar8 = (RootTable *)0x0;
  }
  else {
    pRVar8 = (RootTable *)((ulong)*puVar4 + (long)puVar4);
  }
  fVar10 = v1::RootTable::a(pRVar9);
  fVar11 = v2::RootTable::a(pRVar8);
  TestEq<float,float>(fVar10,fVar11,"\'v1_root->a()\' != \'v2_root->a()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0xe2,"");
  pVVar5 = v1::RootTable::b(pRVar9);
  pVVar6 = v2::RootTable::b(pRVar8);
  TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
            (pVVar5,pVVar6,"\'v1_root->b()\' != \'v2_root->b()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xe4,"");
  pVVar5 = v1::RootTable::b(pRVar9);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar5,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v1_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xe5,"");
  pVVar5 = v2::RootTable::b(pRVar8);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar5,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v2_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xe6,"");
  pVVar7 = v2::RootTable::big_vector(pRVar8);
  TestEq<bool,bool>(true,pVVar7 == (Vector64<uint8_t> *)0x0,
                    "\'true\' != \'v2_root->big_vector() == nullptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0xea,"");
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&builder);
  builder.buf_.allocator_ = (Allocator *)0x0;
  builder.buf_.own_allocator_ = false;
  builder.buf_.initial_size_ = 0x400;
  builder.buf_.max_size_ = 0xffffffff;
  builder.buf_._28_4_ = 0x7fffffff;
  builder.buf_.buffer_minalign_ = 8;
  builder.length_of_64_bit_region_ = 0;
  builder.nested = false;
  builder.finished = false;
  builder.buf_.reserved_ = 0;
  builder.buf_.size_ = 0;
  builder.buf_._52_4_ = 0;
  builder.buf_.buf_ = (uint8_t *)0x0;
  builder.buf_.cur_._0_6_ = 0;
  builder.buf_.cur_._6_2_ = 0;
  builder.buf_.scratch_._0_6_ = 0;
  builder._78_8_ = 0;
  builder.minalign_ = 1;
  builder.force_defaults_ = false;
  builder.dedup_vtables_ = true;
  builder.string_pool = (StringOffsetMap *)0x0;
  OVar3 = v2::CreateRootTableDirect((FlatBufferBuilder64 *)&builder,1234.0,&data,&big_data);
  FlatBufferBuilderImpl<true>::Finish<v2::RootTable>
            ((FlatBufferBuilderImpl<true> *)&builder,OVar3,(char *)0x0);
  puVar4 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer
                             ((FlatBufferBuilderImpl<true> *)&builder);
  if (puVar4 == (uint *)0x0) {
    pRVar9 = (RootTable *)0x0;
  }
  else {
    pRVar9 = (RootTable *)((ulong)*puVar4 + (long)puVar4);
  }
  puVar4 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer
                             ((FlatBufferBuilderImpl<true> *)&builder);
  if (puVar4 == (uint *)0x0) {
    pRVar8 = (RootTable *)0x0;
  }
  else {
    pRVar8 = (RootTable *)((ulong)*puVar4 + (long)puVar4);
  }
  fVar10 = v1::RootTable::a(pRVar9);
  fVar11 = v2::RootTable::a(pRVar8);
  TestEq<float,float>(fVar10,fVar11,"\'v1_root->a()\' != \'v2_root->a()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0xf9,"");
  pVVar5 = v1::RootTable::b(pRVar9);
  pVVar6 = v2::RootTable::b(pRVar8);
  TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
            (pVVar5,pVVar6,"\'v1_root->b()\' != \'v2_root->b()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xfb,"");
  pVVar5 = v1::RootTable::b(pRVar9);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar5,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v1_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xfc,"");
  pVVar5 = v2::RootTable::b(pRVar8);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar5,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v2_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xfd,"");
  pVVar7 = v2::RootTable::big_vector(pRVar8);
  TestEq<bool,bool>(true,pVVar7 != (Vector64<uint8_t> *)0x0,
                    "\'true\' != \'v2_root->big_vector() != nullptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x101,"");
  pVVar7 = v2::RootTable::big_vector(pRVar8);
  TestEq<unsigned_long,unsigned_long>
            (*(unsigned_long *)pVVar7,
             (long)big_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)big_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             "\'v2_root->big_vector()->size()\' != \'big_data.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x102,"");
  pVVar7 = v2::RootTable::big_vector(pRVar8);
  rVar2 = Vector<unsigned_char,_unsigned_long>::Get(pVVar7,2);
  TestEq<unsigned_char,int>
            (rVar2,8,"\'v2_root->big_vector()->Get(2)\' != \'8\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x103,"");
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<true> *)&builder);
  builder.buf_.allocator_ = (Allocator *)0x0;
  builder.buf_.own_allocator_ = false;
  builder.buf_.initial_size_ = 0x400;
  builder.buf_.max_size_ = 0xffffffff;
  builder.buf_._28_4_ = 0x7fffffff;
  builder.buf_.buffer_minalign_ = 8;
  builder.length_of_64_bit_region_ = 0;
  builder.nested = false;
  builder.finished = false;
  builder.buf_.reserved_ = 0;
  builder.buf_.size_ = 0;
  builder.buf_._52_4_ = 0;
  builder.buf_.buf_ = (uint8_t *)0x0;
  builder.buf_.cur_._0_6_ = 0;
  builder.buf_.cur_._6_2_ = 0;
  builder.buf_.scratch_._0_6_ = 0;
  builder._78_8_ = 0;
  builder.minalign_ = 1;
  builder.force_defaults_ = false;
  builder.dedup_vtables_ = true;
  builder.string_pool = (StringOffsetMap *)0x0;
  giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&giant_data,8);
  giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '*';
  OVar3 = v2::CreateRootTableDirect((FlatBufferBuilder64 *)&builder,1234.0,&data,&giant_data);
  FlatBufferBuilderImpl<true>::Finish<v2::RootTable>
            ((FlatBufferBuilderImpl<true> *)&builder,OVar3,(char *)0x0);
  puVar4 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer
                             ((FlatBufferBuilderImpl<true> *)&builder);
  if (puVar4 == (uint *)0x0) {
    pRVar9 = (RootTable *)0x0;
  }
  else {
    pRVar9 = (RootTable *)((ulong)*puVar4 + (long)puVar4);
  }
  puVar4 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer
                             ((FlatBufferBuilderImpl<true> *)&builder);
  if (puVar4 == (uint *)0x0) {
    pRVar8 = (RootTable *)0x0;
  }
  else {
    pRVar8 = (RootTable *)((ulong)*puVar4 + (long)puVar4);
  }
  fVar10 = v1::RootTable::a(pRVar9);
  fVar11 = v2::RootTable::a(pRVar8);
  TestEq<float,float>(fVar10,fVar11,"\'v1_root->a()\' != \'v2_root->a()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0x118,"");
  pVVar5 = v1::RootTable::b(pRVar9);
  pVVar6 = v2::RootTable::b(pRVar8);
  TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
            (pVVar5,pVVar6,"\'v1_root->b()\' != \'v2_root->b()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x11a,"");
  pVVar5 = v1::RootTable::b(pRVar9);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar5,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v1_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x11b,"");
  pVVar5 = v2::RootTable::b(pRVar8);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar5,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v2_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x11c,"");
  pVVar7 = v2::RootTable::big_vector(pRVar8);
  TestEq<bool,bool>(true,pVVar7 != (Vector64<uint8_t> *)0x0,
                    "\'true\' != \'v2_root->big_vector() != nullptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x120,"");
  pVVar7 = v2::RootTable::big_vector(pRVar8);
  TestEq<unsigned_long,unsigned_long>
            (*(unsigned_long *)pVVar7,
             (long)giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             "\'v2_root->big_vector()->size()\' != \'giant_data.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x121,"");
  pVVar7 = v2::RootTable::big_vector(pRVar8);
  rVar2 = Vector<unsigned_char,_unsigned_long>::Get(pVVar7,2);
  TestEq<unsigned_char,int>
            (rVar2,0x2a,"\'v2_root->big_vector()->Get(2)\' != \'42\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x122,"");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<true> *)&builder);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&big_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void Offset64Evolution() {
  // Some common data for the tests.
  const std::vector<uint8_t> data = { 1, 2, 3, 4 };
  const std::vector<uint8_t> big_data = { 6, 7, 8, 9, 10 };

  // Built V1 read V2
  {
    // Use the 32-bit builder since V1 doesn't have any 64-bit offsets.
    FlatBufferBuilder builder;

    builder.Finish(v1::CreateRootTableDirect(builder, 1234, &data));

    // Use each version to get a view at the root table.
    auto v1_root = v1::GetRootTable(builder.GetBufferPointer());
    auto v2_root = v2::GetRootTable(builder.GetBufferPointer());

    // Test field equivalents for fields common to V1 and V2.
    TEST_EQ(v1_root->a(), v2_root->a());

    TEST_EQ(v1_root->b(), v2_root->b());
    TEST_EQ(v1_root->b()->Get(2), 3);
    TEST_EQ(v2_root->b()->Get(2), 3);

    // This field is added in V2, so it should be null since V1 couldn't have
    // written it.
    TEST_ASSERT(v2_root->big_vector() == nullptr);
  }

  // Built V2 read V1
  {
    // Use the 64-bit builder since V2 has 64-bit offsets.
    FlatBufferBuilder64 builder;

    builder.Finish(v2::CreateRootTableDirect(builder, 1234, &data, &big_data));

    // Use each version to get a view at the root table.
    auto v1_root = v1::GetRootTable(builder.GetBufferPointer());
    auto v2_root = v2::GetRootTable(builder.GetBufferPointer());

    // Test field equivalents for fields common to V1 and V2.
    TEST_EQ(v1_root->a(), v2_root->a());

    TEST_EQ(v1_root->b(), v2_root->b());
    TEST_EQ(v1_root->b()->Get(2), 3);
    TEST_EQ(v2_root->b()->Get(2), 3);

    // Test that V2 can read the big vector, which V1 doesn't even have
    // accessors for (i.e. v1_root->big_vector() doesn't exist).
    TEST_ASSERT(v2_root->big_vector() != nullptr);
    TEST_EQ(v2_root->big_vector()->size(), big_data.size());
    TEST_EQ(v2_root->big_vector()->Get(2), 8);
  }

  // Built V2 read V1, bigger than max 32-bit buffer sized.
  // This checks that even a large buffer can still be read by V1.
  {
    // Use the 64-bit builder since V2 has 64-bit offsets.
    FlatBufferBuilder64 builder;

    std::vector<uint8_t> giant_data;
    giant_data.resize(1LL << 3);
    giant_data[2] = 42;

    builder.Finish(
        v2::CreateRootTableDirect(builder, 1234, &data, &giant_data));

    // Use each version to get a view at the root table.
    auto v1_root = v1::GetRootTable(builder.GetBufferPointer());
    auto v2_root = v2::GetRootTable(builder.GetBufferPointer());

    // Test field equivalents for fields common to V1 and V2.
    TEST_EQ(v1_root->a(), v2_root->a());

    TEST_EQ(v1_root->b(), v2_root->b());
    TEST_EQ(v1_root->b()->Get(2), 3);
    TEST_EQ(v2_root->b()->Get(2), 3);

    // Test that V2 can read the big vector, which V1 doesn't even have
    // accessors for (i.e. v1_root->big_vector() doesn't exist).
    TEST_ASSERT(v2_root->big_vector() != nullptr);
    TEST_EQ(v2_root->big_vector()->size(), giant_data.size());
    TEST_EQ(v2_root->big_vector()->Get(2), 42);
  }
}